

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

void __thiscall HighsSearch::flushStatistics(HighsSearch *this)

{
  long lVar1;
  pointer pHVar2;
  HighsCDouble *this_00;
  long in_RDI;
  HighsCDouble *v;
  HighsCDouble local_18;
  
  v = *(HighsCDouble **)(in_RDI + 0x358);
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x69597d);
  pHVar2->num_nodes = (long)&v->hi + pHVar2->num_nodes;
  *(undefined8 *)(in_RDI + 0x358) = 0;
  this_00 = (HighsCDouble *)(in_RDI + 0x380);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6959c0);
  HighsCDouble::operator+=(this_00,v);
  HighsCDouble::HighsCDouble(&local_18,0.0);
  *(double *)(in_RDI + 0x380) = local_18.hi;
  *(double *)(in_RDI + 0x388) = local_18.lo;
  lVar1 = *(long *)(in_RDI + 0x360);
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x695a19);
  pHVar2->total_lp_iterations = lVar1 + pHVar2->total_lp_iterations;
  *(undefined8 *)(in_RDI + 0x360) = 0;
  lVar1 = *(long *)(in_RDI + 0x368);
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x695a5a);
  pHVar2->heuristic_lp_iterations = lVar1 + pHVar2->heuristic_lp_iterations;
  *(undefined8 *)(in_RDI + 0x368) = 0;
  lVar1 = *(long *)(in_RDI + 0x370);
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x695a9b);
  pHVar2->sb_lp_iterations = lVar1 + pHVar2->sb_lp_iterations;
  *(undefined8 *)(in_RDI + 0x370) = 0;
  return;
}

Assistant:

void HighsSearch::flushStatistics() {
  mipsolver.mipdata_->num_nodes += nnodes;
  nnodes = 0;

  mipsolver.mipdata_->pruned_treeweight += treeweight;
  treeweight = 0;

  mipsolver.mipdata_->total_lp_iterations += lpiterations;
  lpiterations = 0;

  mipsolver.mipdata_->heuristic_lp_iterations += heurlpiterations;
  heurlpiterations = 0;

  mipsolver.mipdata_->sb_lp_iterations += sblpiterations;
  sblpiterations = 0;
}